

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test::
TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test
          (TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockSupport_c).super_Utest._vptr_Utest = (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockSupport_c::TEST_GROUP_CppUTestGroupMockSupport_c
            (&this->super_TEST_GROUP_CppUTestGroupMockSupport_c);
  (this->super_TEST_GROUP_CppUTestGroupMockSupport_c).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002d6cf8;
  return;
}

Assistant:

TEST(MockSupport_c, FailWillNotCrashIfNotEnabled)
{
    cpputestHasCrashed = false;
    TestTestingFixture fixture;
    UtestShell::setCrashMethod(crashMethod);

    fixture.setTestFunction(failedCallToMockC);

    fixture.runAllTests();

    CHECK_FALSE(cpputestHasCrashed);
    LONGS_EQUAL(1, fixture.getFailureCount());

    UtestShell::resetCrashMethod();
}